

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anytrans.cpp
# Opt level: O1

Transliterator * __thiscall
icu_63::AnyTransliterator::getTransliterator(AnyTransliterator *this,UScriptCode source)

{
  short sVar1;
  Transliterator *pTVar2;
  char *src;
  UnicodeString *pUVar3;
  Transliterator *value;
  int32_t iVar4;
  Transliterator *pTVar5;
  UErrorCode ec;
  UnicodeString id;
  UnicodeString sourceName;
  UErrorCode local_b8;
  UChar local_b2;
  UChar *local_b0;
  UnicodeString local_a0;
  UnicodeString local_60;
  
  pTVar2 = (Transliterator *)0x0;
  if ((source != USCRIPT_INVALID_CODE) && (this->targetScript != source)) {
    umtx_lock_63((UMutex *)0x0);
    pTVar2 = (Transliterator *)uhash_iget_63(this->cache,source);
    umtx_unlock_63((UMutex *)0x0);
    if (pTVar2 == (Transliterator *)0x0) {
      local_b8 = U_ZERO_ERROR;
      src = uscript_getShortName_63(source);
      icu_63::UnicodeString::UnicodeString(&local_60,src,-1,kInvariant);
      icu_63::UnicodeString::UnicodeString(&local_a0,&local_60);
      local_b2 = L'-';
      pUVar3 = icu_63::UnicodeString::doAppend(&local_a0,&local_b2,0,1);
      sVar1 = (this->target).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar4 = (this->target).fUnion.fFields.fLength;
      }
      else {
        iVar4 = (int)sVar1 >> 5;
      }
      icu_63::UnicodeString::doAppend(pUVar3,&this->target,0,iVar4);
      value = Transliterator::createInstance(&local_a0,UTRANS_FORWARD,&local_b8);
      if ((value == (Transliterator *)0x0) || (U_ZERO_ERROR < local_b8)) {
        if (value != (Transliterator *)0x0) {
          (*(value->super_UObject)._vptr_UObject[1])(value);
        }
        icu_63::UnicodeString::operator=(&local_a0,&local_60);
        pUVar3 = icu_63::UnicodeString::doAppend(&local_a0,L"-Latn;Latn-",0,-1);
        sVar1 = (this->target).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar4 = (this->target).fUnion.fFields.fLength;
        }
        else {
          iVar4 = (int)sVar1 >> 5;
        }
        icu_63::UnicodeString::doAppend(pUVar3,&this->target,0,iVar4);
        local_b0 = L"-Latn;Latn-";
        pTVar2 = Transliterator::createInstance(&local_a0,UTRANS_FORWARD,&local_b8);
        value = (Transliterator *)0x0;
        if (local_b8 < U_ILLEGAL_ARGUMENT_ERROR) {
          value = pTVar2;
        }
        if (U_ZERO_ERROR < local_b8 && pTVar2 != (Transliterator *)0x0) {
          (*(pTVar2->super_UObject)._vptr_UObject[1])();
          value = (Transliterator *)0x0;
        }
      }
      if (value == (Transliterator *)0x0) {
        pTVar2 = (Transliterator *)0x0;
      }
      else {
        umtx_lock_63((UMutex *)0x0);
        pTVar2 = (Transliterator *)uhash_iget_63(this->cache,source);
        pTVar5 = value;
        if (pTVar2 == (Transliterator *)0x0) {
          uhash_iput_63(this->cache,source,value,&local_b8);
          pTVar5 = (Transliterator *)0x0;
          pTVar2 = value;
        }
        umtx_unlock_63((UMutex *)0x0);
        if (pTVar5 != (Transliterator *)0x0) {
          (*(pTVar5->super_UObject)._vptr_UObject[1])(pTVar5);
        }
      }
      icu_63::UnicodeString::~UnicodeString(&local_a0);
      icu_63::UnicodeString::~UnicodeString(&local_60);
    }
  }
  return pTVar2;
}

Assistant:

Transliterator* AnyTransliterator::getTransliterator(UScriptCode source) const {

    if (source == targetScript || source == USCRIPT_INVALID_CODE) {
        return NULL;
    }

    Transliterator* t = NULL;
    {
        Mutex m(NULL);
        t = (Transliterator*) uhash_iget(cache, (int32_t) source);
    }
    if (t == NULL) {
        UErrorCode ec = U_ZERO_ERROR;
        UnicodeString sourceName(uscript_getShortName(source), -1, US_INV);
        UnicodeString id(sourceName);
        id.append(TARGET_SEP).append(target);

        t = Transliterator::createInstance(id, UTRANS_FORWARD, ec);
        if (U_FAILURE(ec) || t == NULL) {
            delete t;

            // Try to pivot around Latin, our most common script
            id = sourceName;
            id.append(LATIN_PIVOT, -1).append(target);
            t = Transliterator::createInstance(id, UTRANS_FORWARD, ec);
            if (U_FAILURE(ec) || t == NULL) {
                delete t;
                t = NULL;
            }
        }

        if (t != NULL) {
            Transliterator *rt = NULL;
            {
                Mutex m(NULL);
                rt = static_cast<Transliterator *> (uhash_iget(cache, (int32_t) source));
                if (rt == NULL) {
                    // Common case, no race to cache this new transliterator.
                    uhash_iput(cache, (int32_t) source, t, &ec);
                } else {
                    // Race case, some other thread beat us to caching this transliterator.
                    Transliterator *temp = rt;
                    rt = t;    // Our newly created transliterator that lost the race & now needs deleting.
                    t  = temp; // The transliterator from the cache that we will return.
                }
            }
            delete rt;    // will be non-null only in case of races.
        }
    }
    return t;
}